

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uniset.cpp
# Opt level: O3

UnicodeSet * __thiscall icu_63::UnicodeSet::compact(UnicodeSet *this)

{
  UChar32 *pUVar1;
  int iVar2;
  
  if ((this->stringSpan == (UnicodeSetStringSpan *)0x0 && this->bmpSet == (BMPSet *)0x0) &&
     ((this->fFlags & 1) == 0)) {
    if (this->buffer != (UChar32 *)0x0) {
      uprv_free_63(this->buffer);
      this->buffer = (UChar32 *)0x0;
    }
    iVar2 = this->len;
    if (iVar2 < this->capacity) {
      iVar2 = iVar2 + (uint)(iVar2 == 0);
      pUVar1 = (UChar32 *)uprv_realloc_63(this->list,(long)iVar2 << 2);
      if (pUVar1 != (UChar32 *)0x0) {
        this->list = pUVar1;
        this->capacity = iVar2;
      }
    }
  }
  return this;
}

Assistant:

UnicodeSet& UnicodeSet::compact() {
    if (isFrozen() || isBogus()) {
        return *this;
    }
    // Delete buffer first to defragment memory less.
    if (buffer != NULL) {
        uprv_free(buffer);
        buffer = NULL;
    }
    if (len < capacity) {
        // Make the capacity equal to len or 1.
        // We don't want to realloc of 0 size.
        int32_t newCapacity = len + (len == 0);
        UChar32* temp = (UChar32*) uprv_realloc(list, sizeof(UChar32) * newCapacity);
        if (temp) {
            list = temp;
            capacity = newCapacity;
        }
        // else what the heck happened?! We allocated less memory!
        // Oh well. We'll keep our original array.
    }
    return *this;
}